

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O3

sz_ssize_t sznet::sz_read(int fd,void *buf,size_t nbyte)

{
  ssize_t sVar1;
  
  sVar1 = read(fd,buf,nbyte);
  return sVar1;
}

Assistant:

sz_ssize_t sz_read(int fd, void* buf, size_t nbyte)
{
#if defined(SZ_OS_WINDOWS)
	if (unlikely(nbyte > std::numeric_limits<unsigned int>::max()))
	{
		assert(0);
	}
	unsigned int count = static_cast<unsigned int>(nbyte);
	return _read(fd, buf, count);
#else
	return read(fd, buf, nbyte);
#endif
}